

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

bool testing::internal::ParseInt32(Message *src_text,char *str,Int32 *value)

{
  long lVar1;
  Message *pMVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  Int32 result;
  long long_value;
  Int32 *value_local;
  Message *src_text_local;
  Message local_70;
  Message msg_1;
  Message msg;
  char *end;
  char *str_local;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  end = str;
  lVar1 = strtol(str,(char **)&msg,10);
  if (*(char *)msg.ss_.ptr_ == '\0') {
    if (((lVar1 == 0x7fffffffffffffff) || (lVar1 == -0x8000000000000000)) || ((int)lVar1 != lVar1))
    {
      Message::Message(&local_70);
      pMVar2 = Message::operator<<(&local_70,(char (*) [10])"WARNING: ");
      pMVar2 = Message::operator<<(pMVar2,src_text);
      pMVar2 = Message::operator<<(pMVar2,(char (*) [50])
                                          " is expected to be a 32-bit integer, but actually");
      pMVar2 = Message::operator<<(pMVar2,(char (*) [12])" has value ");
      pMVar2 = Message::operator<<(pMVar2,&end);
      Message::operator<<(pMVar2,(char (*) [20])", which overflows.\n");
      Message::GetString_abi_cxx11_((string *)&str_local,&local_70);
      uVar3 = std::__cxx11::string::c_str();
      printf("%s",uVar3);
      std::__cxx11::string::~string((string *)&str_local);
      fflush(_stdout);
      src_text_local._7_1_ = false;
      Message::~Message(&local_70);
    }
    else {
      *value = (int)lVar1;
      src_text_local._7_1_ = true;
    }
  }
  else {
    Message::Message(&msg_1);
    pMVar2 = Message::operator<<(&msg_1,(char (*) [10])"WARNING: ");
    pMVar2 = Message::operator<<(pMVar2,src_text);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [50])
                                        " is expected to be a 32-bit integer, but actually");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [13])" has value \"");
    pMVar2 = Message::operator<<(pMVar2,&end);
    Message::operator<<(pMVar2,(char (*) [4])"\".\n");
    Message::GetString_abi_cxx11_(&local_30,&msg_1);
    uVar3 = std::__cxx11::string::c_str();
    printf("%s",uVar3);
    std::__cxx11::string::~string((string *)&local_30);
    fflush(_stdout);
    src_text_local._7_1_ = false;
    Message::~Message(&msg_1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return src_text_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt32(const Message& src_text, const char* str, Int32* value) {
  // Parses the environment variable as a decimal integer.
  char* end = NULL;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value \"" << str << "\".\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const Int32 result = static_cast<Int32>(long_value);
  if (long_value == LONG_MAX || long_value == LONG_MIN ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
      // The parsed value overflows as an Int32.
      ) {
    Message msg;
    msg << "WARNING: " << src_text
        << " is expected to be a 32-bit integer, but actually"
        << " has value " << str << ", which overflows.\n";
    printf("%s", msg.GetString().c_str());
    fflush(stdout);
    return false;
  }

  *value = result;
  return true;
}